

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileInputStream::FileInputStream
          (FileInputStream *this,int file_descriptor,int block_size)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  CopyingFileInputStream *in_RDI;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffe4;
  CopyingInputStream *in_stack_ffffffffffffffe8;
  
  ZeroCopyInputStream::ZeroCopyInputStream((ZeroCopyInputStream *)in_RDI);
  (in_RDI->super_CopyingInputStream)._vptr_CopyingInputStream =
       (_func_int **)&PTR__FileInputStream_00964890;
  CopyingFileInputStream::CopyingFileInputStream(in_RDI,in_stack_ffffffffffffffcc);
  CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
            ((CopyingInputStreamAdaptor *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4);
  return;
}

Assistant:

FileInputStream::FileInputStream(int file_descriptor, int block_size)
    : copying_input_(file_descriptor), impl_(&copying_input_, block_size) {}